

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O1

void accumulate_weighted_avg(vw *all,parameters *weights)

{
  uint32_t uVar1;
  ulong uVar2;
  float *buffer;
  weight *pwVar3;
  byte bVar4;
  uint64_t n;
  uint64_t i;
  uint64_t uVar5;
  
  if (all->adaptive == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n"
               ,0x59);
    return;
  }
  bVar4 = (byte)all->num_bits;
  n = 1L << (bVar4 & 0x3f);
  buffer = (float *)operator_new__(n * 4);
  if (weights->sparse == false) {
    uVar1 = (weights->dense_weights)._stride_shift;
    pwVar3 = (weights->dense_weights)._begin;
    uVar2 = (weights->dense_weights)._weight_mask;
    uVar5 = 0;
    do {
      buffer[uVar5] = pwVar3[(uVar5 << ((byte)uVar1 & 0x3f) & uVar2) + 1];
      uVar5 = uVar5 + 1;
    } while (n != uVar5);
  }
  else {
    uVar5 = 0;
    do {
      pwVar3 = sparse_parameters::operator[]
                         (&weights->sparse_weights,
                          uVar5 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      buffer[uVar5] = pwVar3[1];
      uVar5 = uVar5 + 1;
    } while (n != uVar5);
  }
  all_reduce<float,_&add_float>(all,buffer,n);
  if (weights->sparse == true) {
    do_weighting<sparse_parameters>(all,n,buffer,&weights->sparse_weights);
  }
  else {
    do_weighting<dense_parameters>(all,n,buffer,&weights->dense_weights);
  }
  if (weights->sparse == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"sparse parameters not supported with parallel computation!",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  else {
    all_reduce<float,_&add_float>
              (all,(weights->dense_weights)._begin,
               (long)(1 << ((byte)(weights->dense_weights)._stride_shift & 0x1f)) << (bVar4 & 0x3f))
    ;
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void accumulate_weighted_avg(vw& all, parameters& weights)
{
  if (!all.adaptive)
  {
    all.trace_message << "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n";
    return;
  }
  uint32_t length = 1 << all.num_bits;  // This is the number of parameters
  float* local_weights = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[1];
  else
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[1];

  // First compute weights for averaging
  all_reduce<float, add_float>(all, local_weights, length);

  if (weights.sparse)
    do_weighting(all, length, local_weights, weights.sparse_weights);
  else
    do_weighting(all, length, local_weights, weights.dense_weights);

  if (weights.sparse)
    cout << "sparse parameters not supported with parallel computation!" << endl;
  else
    all_reduce<float, add_float>(all, weights.dense_weights.first(), ((size_t)length) * (1 << weights.stride_shift()));
  delete[] local_weights;
}